

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O2

iterator __thiscall
re2::SparseArray<re2::NFA::Thread_*>::SetExistingInternal
          (SparseArray<re2::NFA::Thread_*> *this,int i,Thread **v)

{
  bool bVar1;
  
  DebugCheckInvariants(this);
  bVar1 = has_index(this,i);
  if (bVar1) {
    (this->dense_).ptr_._M_t.
    super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
    .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>._M_head_impl
    [(this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
     super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>.
     _M_head_impl[i]].value_ = *v;
    DebugCheckInvariants(this);
    return (this->dense_).ptr_._M_t.
           super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
           .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
           _M_head_impl +
           (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl[i];
  }
  __assert_fail("has_index(i)",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/sparse_array.h"
                ,0xe7,
                "iterator re2::SparseArray<re2::NFA::Thread *>::SetExistingInternal(int, const Value &) [Value = re2::NFA::Thread *]"
               );
}

Assistant:

iterator SetExistingInternal(int i, const Value& v) {
    DebugCheckInvariants();
    assert(has_index(i));
    dense_[sparse_[i]].value_ = v;
    DebugCheckInvariants();
    return dense_.data() + sparse_[i];
  }